

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtest.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  FILE *pFVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  undefined8 uVar9;
  long lVar10;
  uint uVar11;
  size_t __size;
  ulong uVar12;
  png_structp dummy_ptr;
  undefined8 local_40;
  uint local_34;
  
  local_34 = argc;
  fprintf(_stdout,"\n Testing libpng version %s\n","1.6.48.git");
  fprintf(_stdout,"   with zlib   version %s\n","1.2.11");
  pFVar4 = _stdout;
  pcVar8 = (char *)png_get_copyright(0);
  fputs(pcVar8,pFVar4);
  pFVar4 = _stdout;
  uVar5 = png_access_version_number();
  uVar9 = png_get_header_version(0);
  fprintf(pFVar4," library (%lu):%s",(ulong)uVar5,uVar9);
  fprintf(_stdout," pngtest (%lu):%s",0x2998," libpng version 1.6.48.git\n");
  pcVar8 = (char *)png_get_header_ver(0);
  iVar6 = strcmp(pcVar8,"1.6.48.git");
  if (iVar6 != 0) {
    fwrite("Warning: mismatching versions of png.h and png.c\n",0x31,1,_stdout);
    fprintf(_stdout,"  png.h version string: %s\n","1.6.48.git");
    pFVar4 = _stdout;
    uVar9 = png_get_header_ver(0);
    fprintf(pFVar4,"  png.c version string: %s\n\n",uVar9);
  }
  uVar5 = local_34;
  uVar11 = (uint)(iVar6 != 0);
  if ((int)local_34 < 2) {
LAB_001039af:
    bVar2 = true;
    bVar3 = false;
  }
  else {
    pcVar8 = argv[1];
    iVar6 = strcmp(pcVar8,"-m");
    if (iVar6 == 0) {
LAB_0010398c:
      status_dots_requested = 0;
    }
    else {
      iVar6 = strcmp(pcVar8,"-mv");
      if ((iVar6 != 0) && (iVar6 = strcmp(pcVar8,"-vm"), iVar6 != 0)) {
        iVar6 = strcmp(pcVar8,"-v");
        if (iVar6 == 0) {
          verbose = 1;
          status_dots_requested = 1;
          inname = argv[2];
          goto LAB_001039af;
        }
        iVar6 = strcmp(pcVar8,"--strict");
        if (iVar6 == 0) {
          verbose = 1;
          inname = argv[2];
          strict = strict + 1;
          relaxed = 0;
        }
        else {
          iVar6 = strcmp(pcVar8,"--relaxed");
          if (iVar6 == 0) {
            inname = argv[2];
          }
          else {
            iVar6 = strcmp(pcVar8,"--xfail");
            if (iVar6 != 0) {
              status_dots_requested = 0;
              inname = pcVar8;
              goto LAB_001039af;
            }
            inname = argv[2];
            xfail = xfail + 1;
          }
          verbose = 1;
          relaxed = relaxed + 1;
          strict = 0;
        }
        goto LAB_0010398c;
      }
      verbose = 1;
      status_dots_requested = 1;
    }
    bVar3 = true;
    bVar2 = false;
  }
  if (bVar2) {
    uVar1 = verbose + 3;
    if (uVar1 == uVar5) {
      outname = argv[(ulong)(uint)verbose + 2];
    }
    if (bVar2) {
      if ((!(bool)((int)uVar5 < 2 & bVar3)) && ((int)uVar5 <= (int)uVar1)) goto LAB_00103a52;
      goto LAB_001039ed;
    }
  }
  if (!bVar3 || 1 < (int)uVar5) {
LAB_00103a52:
    if (bVar3) {
      if (2 < (int)uVar5) {
        uVar12 = 2;
        do {
          fprintf(_stdout,"\n Testing %s:",argv[uVar12]);
          iVar6 = test_one_file(argv[uVar12],outname);
          if (iVar6 == 0) {
            fprintf(_stdout,"\n PASS (%lu zero samples)\n",(ulong)zero_samples);
            if (tIME_chunk_present != 0) {
              fprintf(_stdout," tIME = %s\n",tIME_string);
            }
            tIME_chunk_present = 0;
          }
          else if (xfail == 0) {
            fwrite(" FAIL\n",6,1,_stdout);
            uVar11 = uVar11 + 1;
          }
          else {
            fwrite(" XFAIL\n",7,1,_stdout);
          }
          uVar12 = uVar12 + 1;
        } while (uVar5 != uVar12);
      }
    }
    else {
      iVar6 = 3;
      do {
        if ((iVar6 == 2) || (verbose == 0)) {
          status_dots_requested = iVar6 == 2;
        }
        if (((iVar6 == 3) || ((verbose & 1) != 0)) || (uVar11 != 0)) {
          fprintf(_stdout,"\n Testing %s:",inname);
        }
        iVar7 = test_one_file(inname,outname);
        if (iVar7 == 0) {
          if ((iVar6 == 1 || (verbose & 1) != 0) &&
             (fprintf(_stdout,"\n PASS (%lu zero samples)\n",(ulong)zero_samples),
             tIME_chunk_present != 0)) {
            fprintf(_stdout," tIME = %s\n",tIME_string);
          }
        }
        else {
          if (iVar6 != 1 && (verbose & 1) == 0) {
            fprintf(_stdout,"\n Testing %s:",inname);
          }
          if (xfail == 0) {
            fwrite(" FAIL\n",6,1,_stdout);
            uVar11 = uVar11 + iVar7;
          }
          else {
            fwrite(" XFAIL\n",7,1,_stdout);
          }
        }
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    if (uVar11 == 0) {
      pcVar8 = " libpng passes test\n";
      __size = 0x14;
    }
    else {
      pcVar8 = " libpng FAILS test\n";
      __size = 0x13;
    }
    fwrite(pcVar8,__size,1,_stdout);
    local_40 = png_create_read_struct("1.6.48.git",0,0,0);
    fwrite(" Default limits:\n",0x11,1,_stdout);
    pFVar4 = _stdout;
    uVar5 = png_get_user_width_max(local_40);
    fprintf(pFVar4,"  width_max  = %lu\n",(ulong)uVar5);
    pFVar4 = _stdout;
    uVar5 = png_get_user_height_max(local_40);
    fprintf(pFVar4,"  height_max = %lu\n",(ulong)uVar5);
    iVar6 = png_get_chunk_cache_max(local_40);
    pFVar4 = _stdout;
    if (iVar6 == 0) {
      fwrite("  cache_max  = unlimited\n",0x19,1,_stdout);
    }
    else {
      uVar5 = png_get_chunk_cache_max(local_40);
      fprintf(pFVar4,"  cache_max  = %lu\n",(ulong)uVar5);
    }
    lVar10 = png_get_chunk_malloc_max(local_40);
    pFVar4 = _stdout;
    if (lVar10 == 0) {
      fwrite("  malloc_max = unlimited\n",0x19,1,_stdout);
    }
    else {
      uVar9 = png_get_chunk_malloc_max(local_40);
      fprintf(pFVar4,"  malloc_max = %lu\n",uVar9);
    }
    png_destroy_read_struct(&local_40,0,0);
    return (int)(uVar11 != 0);
  }
LAB_001039ed:
  fprintf(_stdout,"usage: %s [infile.png] [outfile.png]\n\t%s -m {infile.png}\n",*argv);
  fwrite("  reads/writes one PNG file (without -m) or multiple files (-m)\n",0x40,1,_stdout);
  fprintf(_stdout,"  with -m %s is used as a temporary file\n",outname);
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
   int multiple = 0;
   int ierror = 0;

   png_structp dummy_ptr;

   fprintf(STDERR, "\n Testing libpng version %s\n", PNG_LIBPNG_VER_STRING);
   fprintf(STDERR, "   with zlib   version %s\n", ZLIB_VERSION);
   fprintf(STDERR, "%s", png_get_copyright(NULL));
   /* Show the version of libpng used in building the library */
   fprintf(STDERR, " library (%lu):%s",
       (unsigned long)png_access_version_number(),
       png_get_header_version(NULL));

   /* Show the version of libpng used in building the application */
   fprintf(STDERR, " pngtest (%lu):%s", (unsigned long)PNG_LIBPNG_VER,
       PNG_HEADER_VERSION_STRING);

   /* Do some consistency checking on the memory allocation settings, I'm
    * not sure this matters, but it is nice to know, the first of these
    * tests should be impossible because of the way the macros are set
    * in pngconf.h
    */
#if defined(MAXSEG_64K) && !defined(PNG_MAX_MALLOC_64K)
      fprintf(STDERR, " NOTE: Zlib compiled for max 64k, libpng not\n");
#endif
   /* I think the following can happen. */
#if !defined(MAXSEG_64K) && defined(PNG_MAX_MALLOC_64K)
      fprintf(STDERR, " NOTE: libpng compiled for max 64k, zlib not\n");
#endif

   if (strcmp(png_libpng_ver, PNG_LIBPNG_VER_STRING) != 0)
   {
      fprintf(STDERR, "Warning: mismatching versions of png.h and png.c\n");
      fprintf(STDERR, "  png.h version string: %s\n", PNG_LIBPNG_VER_STRING);
      fprintf(STDERR, "  png.c version string: %s\n\n", png_libpng_ver);
      ++ierror;
   }

   if (argc > 1)
   {
      if (strcmp(argv[1], "-m") == 0)
      {
         multiple = 1;
         status_dots_requested = 0;
      }

      else if (strcmp(argv[1], "-mv") == 0 ||
               strcmp(argv[1], "-vm") == 0 )
      {
         multiple = 1;
         verbose = 1;
         status_dots_requested = 1;
      }

      else if (strcmp(argv[1], "-v") == 0)
      {
         verbose = 1;
         status_dots_requested = 1;
         inname = argv[2];
      }

      else if (strcmp(argv[1], "--strict") == 0)
      {
         status_dots_requested = 0;
         verbose = 1;
         inname = argv[2];
         strict++;
         relaxed = 0;
         multiple = 1;
      }

      else if (strcmp(argv[1], "--relaxed") == 0)
      {
         status_dots_requested = 0;
         verbose = 1;
         inname = argv[2];
         strict = 0;
         relaxed++;
         multiple = 1;
      }
      else if (strcmp(argv[1], "--xfail") == 0)
      {
         status_dots_requested = 0;
         verbose = 1;
         inname = argv[2];
         strict = 0;
         xfail++;
         relaxed++;
         multiple = 1;
      }

      else
      {
         inname = argv[1];
         status_dots_requested = 0;
      }
   }

   if (multiple == 0 && argc == 3 + verbose)
      outname = argv[2 + verbose];

   if ((multiple == 0 && argc > 3 + verbose) ||
       (multiple != 0 && argc < 2))
   {
      fprintf(STDERR,
          "usage: %s [infile.png] [outfile.png]\n\t%s -m {infile.png}\n",
          argv[0], argv[0]);
      fprintf(STDERR,
          "  reads/writes one PNG file (without -m) or multiple files (-m)\n");
      fprintf(STDERR,
          "  with -m %s is used as a temporary file\n", outname);
      exit(1);
   }

   if (multiple != 0)
   {
      int i;
#if defined(PNG_USER_MEM_SUPPORTED) && PNG_DEBUG
      int allocation_now = current_allocation;
#endif
      for (i = 2; i < argc; ++i)
      {
         int kerror;
         fprintf(STDERR, "\n Testing %s:", argv[i]);
#if PNG_DEBUG > 0
         fprintf(STDERR, "\n");
#endif
         kerror = test_one_file(argv[i], outname);
         if (kerror == 0)
         {
#ifdef PNG_WRITE_USER_TRANSFORM_SUPPORTED
            fprintf(STDERR, "\n PASS (%lu zero samples)\n",
                (unsigned long)zero_samples);
#else
            fprintf(STDERR, " PASS\n");
#endif
#ifdef PNG_TIME_RFC1123_SUPPORTED
            if (tIME_chunk_present != 0)
               fprintf(STDERR, " tIME = %s\n", tIME_string);

            tIME_chunk_present = 0;
#endif /* TIME_RFC1123 */
         }

         else
         {
            if (xfail)
              fprintf(STDERR, " XFAIL\n");
            else
            {
              fprintf(STDERR, " FAIL\n");
              ierror += kerror;
            }
         }
#if defined(PNG_USER_MEM_SUPPORTED) && PNG_DEBUG
         if (allocation_now != current_allocation)
            fprintf(STDERR, "MEMORY ERROR: %d bytes lost\n",
                current_allocation - allocation_now);

         if (current_allocation != 0)
         {
            memory_infop pinfo = pinformation;

            fprintf(STDERR, "MEMORY ERROR: %d bytes still allocated\n",
                current_allocation);

            while (pinfo != NULL)
            {
               fprintf(STDERR, " %lu bytes at %p\n",
                   (unsigned long)pinfo->size,
                   pinfo->pointer);
               pinfo = pinfo->next;
            }
         }
#endif
      }
#if defined(PNG_USER_MEM_SUPPORTED) && PNG_DEBUG
         fprintf(STDERR, " Current memory allocation: %10d bytes\n",
             current_allocation);
         fprintf(STDERR, " Maximum memory allocation: %10d bytes\n",
             maximum_allocation);
         fprintf(STDERR, " Total   memory allocation: %10d bytes\n",
             total_allocation);
         fprintf(STDERR, "     Number of allocations: %10d\n",
             num_allocations);
#endif
   }

   else
   {
      int i;
      for (i = 0; i < 3; ++i)
      {
         int kerror;
#if defined(PNG_USER_MEM_SUPPORTED) && PNG_DEBUG
         int allocation_now = current_allocation;
#endif
         if (i == 1)
            status_dots_requested = 1;

         else if (verbose == 0)
            status_dots_requested = 0;

         if (i == 0 || verbose == 1 || ierror != 0)
         {
            fprintf(STDERR, "\n Testing %s:", inname);
#if PNG_DEBUG > 0
            fprintf(STDERR, "\n");
#endif
         }

         kerror = test_one_file(inname, outname);

         if (kerror == 0)
         {
            if (verbose == 1 || i == 2)
            {
#ifdef PNG_WRITE_USER_TRANSFORM_SUPPORTED
                fprintf(STDERR, "\n PASS (%lu zero samples)\n",
                    (unsigned long)zero_samples);
#else
                fprintf(STDERR, " PASS\n");
#endif
#ifdef PNG_TIME_RFC1123_SUPPORTED
             if (tIME_chunk_present != 0)
                fprintf(STDERR, " tIME = %s\n", tIME_string);
#endif /* TIME_RFC1123 */
            }
         }

         else
         {
            if (verbose == 0 && i != 2)
            {
               fprintf(STDERR, "\n Testing %s:", inname);
#if PNG_DEBUG > 0
               fprintf(STDERR, "\n");
#endif
            }

            if (xfail)
              fprintf(STDERR, " XFAIL\n");
            else
            {
              fprintf(STDERR, " FAIL\n");
              ierror += kerror;
            }
         }
#if defined(PNG_USER_MEM_SUPPORTED) && PNG_DEBUG
         if (allocation_now != current_allocation)
             fprintf(STDERR, "MEMORY ERROR: %d bytes lost\n",
                 current_allocation - allocation_now);

         if (current_allocation != 0)
         {
             memory_infop pinfo = pinformation;

             fprintf(STDERR, "MEMORY ERROR: %d bytes still allocated\n",
                 current_allocation);

             while (pinfo != NULL)
             {
                fprintf(STDERR, " %lu bytes at %p\n",
                    (unsigned long)pinfo->size, pinfo->pointer);
                pinfo = pinfo->next;
             }
          }
#endif
       }
#if defined(PNG_USER_MEM_SUPPORTED) && PNG_DEBUG
       fprintf(STDERR, " Current memory allocation: %10d bytes\n",
           current_allocation);
       fprintf(STDERR, " Maximum memory allocation: %10d bytes\n",
           maximum_allocation);
       fprintf(STDERR, " Total   memory allocation: %10d bytes\n",
           total_allocation);
       fprintf(STDERR, "     Number of allocations: %10d\n",
           num_allocations);
#endif
   }

#ifdef PNGTEST_TIMING
   t_stop = (float)clock();
   t_misc += (t_stop - t_start);
   t_start = t_stop;
   fprintf(STDERR, " CPU time used = %.3f seconds",
       (t_misc+t_decode+t_encode)/(float)CLOCKS_PER_SEC);
   fprintf(STDERR, " (decoding %.3f,\n",
       t_decode/(float)CLOCKS_PER_SEC);
   fprintf(STDERR, "        encoding %.3f ,",
       t_encode/(float)CLOCKS_PER_SEC);
   fprintf(STDERR, " other %.3f seconds)\n\n",
       t_misc/(float)CLOCKS_PER_SEC);
#endif

   if (ierror == 0)
      fprintf(STDERR, " libpng passes test\n");

   else
      fprintf(STDERR, " libpng FAILS test\n");

   dummy_ptr = png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
#ifdef PNG_USER_LIMITS_SUPPORTED
   fprintf(STDERR, " Default limits:\n");
   fprintf(STDERR, "  width_max  = %lu\n",
       (unsigned long) png_get_user_width_max(dummy_ptr));
   fprintf(STDERR, "  height_max = %lu\n",
       (unsigned long) png_get_user_height_max(dummy_ptr));
   if (png_get_chunk_cache_max(dummy_ptr) == 0)
      fprintf(STDERR, "  cache_max  = unlimited\n");
   else
      fprintf(STDERR, "  cache_max  = %lu\n",
          (unsigned long) png_get_chunk_cache_max(dummy_ptr));
   if (png_get_chunk_malloc_max(dummy_ptr) == 0)
      fprintf(STDERR, "  malloc_max = unlimited\n");
   else
      fprintf(STDERR, "  malloc_max = %lu\n",
          (unsigned long) png_get_chunk_malloc_max(dummy_ptr));
#endif
   png_destroy_read_struct(&dummy_ptr, NULL, NULL);

   return (ierror != 0);
}